

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::ShaderOperatorCase::ShaderOperatorCase
          (ShaderOperatorCase *this,Context *context,char *caseName,char *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,char *shaderOp,ShaderDataSpec *spec)

{
  uint uVar1;
  OperatorShaderEvaluator *this_00;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_01;
  float fVar2;
  float fVar3;
  Precision PVar4;
  DataType DVar5;
  ShaderOperatorCase *pSVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  ostream *poVar10;
  char *pcVar11;
  int precision;
  int precision_00;
  int i;
  long lVar12;
  int i_4;
  Precision precision_01;
  int rowNdx;
  ostringstream *poVar13;
  int i_3;
  ShaderValue *pSVar14;
  undefined1 *puVar15;
  bool bVar16;
  float fVar17;
  ShaderValue *local_400;
  char *local_3e8;
  Vector<float,_4> local_3d0;
  OperatorShaderEvaluator *local_3c0;
  ShaderOperatorCase *local_3b8;
  ShaderValue *local_3b0;
  undefined1 local_3a8 [16];
  Mat4 attribMatrix;
  char *inputPrecision [3];
  string prefix;
  ostringstream vtx;
  ostringstream frag;
  
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_00719cb0;
  this_00 = &this->m_evaluator;
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,caseName,description,isVertexCase,
             &this_00->super_ShaderEvaluator);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_00719cb0;
  local_3c0 = this_00;
  local_3b8 = this;
  OperatorShaderEvaluator::OperatorShaderEvaluator
            (this_00,evalFunc,spec->resultScale,spec->resultBias);
  if (spec->precision == PRECISION_LAST) {
    local_3e8 = (char *)0x0;
  }
  else {
    local_3e8 = glu::getPrecisionName(spec->precision);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  poVar13 = (ostringstream *)&frag;
  if (isVertexCase) {
    poVar13 = (ostringstream *)&vtx;
  }
  pSVar14 = spec->inputs;
  local_3b0 = pSVar14;
  for (lVar12 = 0; lVar12 < spec->numInputs; lVar12 = lVar12 + 1) {
    PVar4 = spec->precision;
    precision_01 = PVar4;
    if (PVar4 == PRECISION_LOWP) {
      precision_01 = PRECISION_MEDIUMP;
    }
    if (3 < pSVar14->type - TYPE_INT) {
      precision_01 = PVar4;
    }
    if (pSVar14->type - TYPE_BOOL < 4) {
      precision_01 = PRECISION_MEDIUMP;
    }
    pcVar8 = glu::getPrecisionName(precision_01);
    inputPrecision[lVar12] = pcVar8;
    pSVar14 = pSVar14 + 1;
  }
  std::operator<<((ostream *)&vtx,"attribute highp vec4 a_position;\n");
  for (lVar12 = 0; uVar9 = (ulong)spec->numInputs, lVar12 < (long)uVar9; lVar12 = lVar12 + 1) {
    poVar10 = std::operator<<((ostream *)&vtx,"attribute ");
    poVar10 = std::operator<<(poVar10,inputPrecision[lVar12]);
    poVar10 = std::operator<<(poVar10," vec4 a_in");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)lVar12);
    std::operator<<(poVar10,";\n");
  }
  if (isVertexCase) {
    std::operator<<((ostream *)&vtx,"varying mediump vec4 v_color;\n");
    std::operator<<((ostream *)&frag,"varying mediump vec4 v_color;\n");
  }
  else {
    for (lVar12 = 0; lVar12 < (int)uVar9; lVar12 = lVar12 + 1) {
      poVar10 = std::operator<<((ostream *)&vtx,"varying ");
      pcVar8 = inputPrecision[lVar12];
      poVar10 = std::operator<<(poVar10,pcVar8);
      poVar10 = std::operator<<(poVar10," vec4 v_in");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)lVar12);
      std::operator<<(poVar10,";\n");
      poVar10 = std::operator<<((ostream *)&frag,"varying ");
      poVar10 = std::operator<<(poVar10,pcVar8);
      poVar10 = std::operator<<(poVar10," vec4 v_in");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)lVar12);
      std::operator<<(poVar10,";\n");
      uVar9 = (ulong)(uint)spec->numInputs;
    }
  }
  std::operator<<((ostream *)&vtx,"\n");
  std::operator<<((ostream *)&vtx,"void main()\n");
  std::operator<<((ostream *)&vtx,"{\n");
  std::operator<<((ostream *)&vtx,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)&frag,"\n");
  std::operator<<((ostream *)&frag,"void main()\n");
  std::operator<<((ostream *)&frag,"{\n");
  pcVar8 = "v_";
  if (isVertexCase) {
    pcVar8 = "a_";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix,pcVar8,(allocator<char> *)&attribMatrix);
  puVar15 = s_inSwizzles;
  lVar12 = 0;
  local_400 = local_3b0;
  do {
    if (spec->numInputs <= lVar12) {
      pcVar8 = glu::getDataTypeName(spec->output);
      DVar5 = spec->output;
      std::operator<<((ostream *)poVar13,"\t");
      if ((local_3e8 != (char *)0x0) && (3 < DVar5 - TYPE_BOOL)) {
        poVar10 = std::operator<<((ostream *)poVar13,local_3e8);
        std::operator<<(poVar10," ");
      }
      poVar10 = std::operator<<((ostream *)poVar13,pcVar8);
      poVar10 = std::operator<<(poVar10," res = ");
      poVar10 = std::operator<<(poVar10,pcVar8);
      std::operator<<(poVar10,"(0.0);\n\n");
      poVar10 = std::operator<<((ostream *)poVar13,"\t");
      poVar10 = std::operator<<(poVar10,shaderOp);
      std::operator<<(poVar10,"\n\n");
      DVar5 = spec->output;
      iVar7 = glu::getDataTypeScalarSize(DVar5);
      std::operator<<((ostream *)poVar13,"\tmediump vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n");
      poVar10 = std::operator<<((ostream *)poVar13,"\tcolor.");
      poVar10 = std::operator<<(poVar10,_ZN4deqp5gles210FunctionalL13s_outSwizzlesE_rel +
                                        *(int *)(_ZN4deqp5gles210FunctionalL13s_outSwizzlesE_rel +
                                                (long)(iVar7 + -1) * 4));
      std::operator<<(poVar10," = ");
      bVar16 = DVar5 - TYPE_FLOAT < 4;
      pcVar8 = "float(res)";
      if (bVar16) {
        pcVar8 = "res";
      }
      if (iVar7 != 1) {
        pcVar8 = "res";
      }
      poVar10 = (ostream *)poVar13;
      if (iVar7 != 1 && !bVar16) {
        poVar10 = std::operator<<((ostream *)poVar13,"vec");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
        pcVar8 = "(res)";
      }
      std::operator<<(poVar10,pcVar8);
      std::operator<<((ostream *)poVar13,";\n");
      fVar2 = spec->resultScale;
      fVar3 = spec->resultBias;
      if ((((fVar2 != 1.0) || (NAN(fVar2))) || (fVar3 != 0.0)) || (NAN(fVar3))) {
        std::operator<<((ostream *)poVar13,"\tcolor = color");
        if ((fVar2 != 1.0) || (NAN(fVar2))) {
          poVar10 = std::operator<<((ostream *)poVar13," * ");
          de::floatToString_abi_cxx11_((string *)&attribMatrix,(de *)0x2,fVar2,precision);
          std::operator<<(poVar10,(string *)&attribMatrix);
          std::__cxx11::string::~string((string *)&attribMatrix);
        }
        if ((fVar3 != 0.0) || (NAN(fVar3))) {
          poVar10 = std::operator<<((ostream *)poVar13," + ");
          de::floatToString_abi_cxx11_((string *)&attribMatrix,(de *)0x2,fVar3,precision_00);
          std::operator<<(poVar10,(string *)&attribMatrix);
          std::__cxx11::string::~string((string *)&attribMatrix);
        }
        std::operator<<((ostream *)poVar13,";\n");
      }
      if (isVertexCase) {
        std::operator<<((ostream *)&vtx,"\tv_color = color;\n");
        pcVar8 = "\tgl_FragColor = v_color;\n";
      }
      else {
        pcVar8 = "\tgl_FragColor = color;\n";
        for (iVar7 = 0; iVar7 < spec->numInputs; iVar7 = iVar7 + 1) {
          poVar10 = std::operator<<((ostream *)&vtx,"\tv_in");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
          poVar10 = std::operator<<(poVar10," = a_in");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
          std::operator<<(poVar10,";\n");
        }
      }
      std::operator<<((ostream *)&frag,pcVar8);
      std::operator<<((ostream *)&vtx,"}\n");
      std::operator<<((ostream *)&frag,"}\n");
      std::__cxx11::stringbuf::str();
      pSVar6 = local_3b8;
      std::__cxx11::string::operator=
                ((string *)&(local_3b8->super_ShaderRenderCase).m_vertShaderSource,
                 (string *)&attribMatrix);
      std::__cxx11::string::~string((string *)&attribMatrix);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)&(pSVar6->super_ShaderRenderCase).m_fragShaderSource,
                 (string *)&attribMatrix);
      std::__cxx11::string::~string((string *)&attribMatrix);
      this_01 = &(pSVar6->super_ShaderRenderCase).m_userAttribTransforms;
      std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
                (this_01,(long)spec->numInputs);
      lVar12 = 0;
      do {
        if (spec->numInputs <= lVar12) {
          std::__cxx11::string::~string((string *)&prefix);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
          return;
        }
        fVar2 = local_3b0[lVar12].rangeMin;
        fVar3 = local_3b0[lVar12].rangeMax;
        tcu::Matrix<float,_4,_4>::Matrix(&attribMatrix);
        local_3a8 = ZEXT416((uint)(fVar3 - fVar2));
        fVar17 = -(fVar3 - fVar2);
        for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
          tcu::Vector<float,_4>::Vector(&local_3d0);
          switch((long)(iVar7 + (int)lVar12) % 4 & 0xffffffff) {
          case 0:
            local_3d0.m_data[0] = (float)local_3a8._0_4_;
            local_3d0.m_data[1] = 0.0;
            local_3d0.m_data[3] = fVar2;
            break;
          case 1:
            local_3d0.m_data[0] = 0.0;
            local_3d0.m_data[1] = (float)local_3a8._0_4_;
            local_3d0.m_data[3] = fVar2;
            break;
          case 2:
            local_3d0.m_data[1] = 0.0;
            local_3d0.m_data[3] = fVar3;
            local_3d0.m_data[0] = fVar17;
            break;
          case 3:
            local_3d0.m_data[0] = 0.0;
            local_3d0.m_data[1] = fVar17;
            local_3d0.m_data[3] = fVar3;
            break;
          default:
            goto switchD_0032dfb3_default;
          }
          local_3d0.m_data[2] = 0.0;
switchD_0032dfb3_default:
          tcu::Matrix<float,_4,_4>::setRow(&attribMatrix,iVar7,&local_3d0);
        }
        tcu::Matrix<float,_4,_4>::operator=
                  ((this_01->
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar12,&attribMatrix);
        lVar12 = lVar12 + 1;
      } while( true );
    }
    DVar5 = local_400->type;
    iVar7 = glu::getDataTypeScalarSize(DVar5);
    pcVar11 = glu::getDataTypeName(DVar5);
    local_3a8._0_8_ = puVar15;
    pcVar8 = *(char **)(puVar15 + (long)(iVar7 + -1) * 8);
    std::operator<<((ostream *)poVar13,"\t");
    uVar1 = DVar5 - TYPE_BOOL;
    if (local_3e8 != (char *)0x0 && 3 < uVar1) {
      poVar10 = std::operator<<((ostream *)poVar13,local_3e8);
      std::operator<<(poVar10," ");
    }
    poVar10 = std::operator<<((ostream *)poVar13,pcVar11);
    poVar10 = std::operator<<(poVar10," in");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)lVar12);
    std::operator<<(poVar10," = ");
    if (uVar1 < 4) {
      pcVar11 = "greaterThan(";
      poVar10 = (ostream *)poVar13;
      if (iVar7 == 1) {
        pcVar11 = "(";
      }
LAB_0032db16:
      std::operator<<(poVar10,pcVar11);
    }
    else if (DVar5 - TYPE_INT < 4) {
      poVar10 = std::operator<<((ostream *)poVar13,pcVar11);
      pcVar11 = "(";
      goto LAB_0032db16;
    }
    poVar10 = std::operator<<((ostream *)poVar13,(string *)&prefix);
    poVar10 = std::operator<<(poVar10,"in");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)lVar12);
    poVar10 = std::operator<<(poVar10,".");
    std::operator<<(poVar10,pcVar8);
    poVar10 = (ostream *)poVar13;
    if (uVar1 < 4) {
      pcVar8 = " > 0.0)";
      if (iVar7 != 1) {
        poVar10 = std::operator<<((ostream *)poVar13,", vec");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
        pcVar8 = "(0.0))";
      }
LAB_0032dbab:
      std::operator<<(poVar10,pcVar8);
    }
    else {
      pcVar8 = ")";
      if (DVar5 - TYPE_INT < 4) goto LAB_0032dbab;
    }
    std::operator<<((ostream *)poVar13,";\n");
    lVar12 = lVar12 + 1;
    puVar15 = (undefined1 *)(local_3a8._0_8_ + 0x20);
    local_400 = local_400 + 1;
  } while( true );
}

Assistant:

ShaderOperatorCase::ShaderOperatorCase (Context& context, const char* caseName, const char* description, bool isVertexCase, ShaderEvalFunc evalFunc, const char* shaderOp, const ShaderDataSpec& spec)
	: ShaderRenderCase(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), caseName, description, isVertexCase, m_evaluator)
	, m_evaluator(evalFunc, spec.resultScale, spec.resultBias)
{
	const char*		precision	= spec.precision != PRECISION_LAST ? getPrecisionName(spec.precision) : DE_NULL;
	const char*		inputPrecision[MAX_INPUTS];

	ostringstream	vtx;
	ostringstream	frag;
	ostringstream&	op			= isVertexCase ? vtx : frag;

	// Compute precision for inputs.
	for (int i = 0; i < spec.numInputs; i++)
	{
		bool		isBoolVal	= de::inRange<int>(spec.inputs[i].type, TYPE_BOOL, TYPE_BOOL_VEC4);
		bool		isIntVal	= de::inRange<int>(spec.inputs[i].type, TYPE_INT, TYPE_INT_VEC4);
		// \note Mediump interpolators are used for booleans and lowp ints.
		Precision	prec		= isBoolVal || (isIntVal && spec.precision == PRECISION_LOWP) ? PRECISION_MEDIUMP : spec.precision;
		inputPrecision[i] = getPrecisionName(prec);
	}

	// Attributes.
	vtx << "attribute highp vec4 a_position;\n";
	for (int i = 0; i < spec.numInputs; i++)
		vtx << "attribute " << inputPrecision[i] << " vec4 a_in" << i << ";\n";

	if (isVertexCase)
	{
		vtx << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}
	else
	{
		for (int i = 0; i < spec.numInputs; i++)
		{
			vtx << "varying " << inputPrecision[i] << " vec4 v_in" << i << ";\n";
			frag << "varying " << inputPrecision[i] << " vec4 v_in" << i << ";\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Expression inputs.
	string prefix = isVertexCase ? "a_" : "v_";
	for (int i = 0; i < spec.numInputs; i++)
	{
		DataType		inType		= spec.inputs[i].type;
		int				inSize		= getDataTypeScalarSize(inType);
		bool			isInt		= de::inRange<int>(inType, TYPE_INT, TYPE_INT_VEC4);
		bool			isBool		= de::inRange<int>(inType, TYPE_BOOL, TYPE_BOOL_VEC4);
		const char*		typeName	= getDataTypeName(inType);
		const char*		swizzle		= s_inSwizzles[i][inSize-1];

		op << "\t";
		if (precision && !isBool) op << precision << " ";

		op << typeName << " in" << i << " = ";

		if (isBool)
		{
			if (inSize == 1)	op << "(";
			else				op << "greaterThan(";
		}
		else if (isInt)
			op << typeName << "(";

		op << prefix << "in" << i << "." << swizzle;

		if (isBool)
		{
			if (inSize == 1)	op << " > 0.0)";
			else				op << ", vec" << inSize << "(0.0))";
		}
		else if (isInt)
			op << ")";

		op << ";\n";
	}

	// Result variable.
	{
		const char* outTypeName = getDataTypeName(spec.output);
		bool		isBoolOut	= de::inRange<int>(spec.output, TYPE_BOOL, TYPE_BOOL_VEC4);

		op << "\t";
		if (precision && !isBoolOut) op << precision << " ";
		op << outTypeName << " res = " << outTypeName << "(0.0);\n\n";
	}

	// Expression.
	op << "\t" << shaderOp << "\n\n";

	// Convert to color.
	bool	isResFloatVec	= de::inRange<int>(spec.output, TYPE_FLOAT, TYPE_FLOAT_VEC4);
	int		outScalarSize	= getDataTypeScalarSize(spec.output);

	op << "\tmediump vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n";
	op << "\tcolor." << s_outSwizzles[outScalarSize-1] << " = ";

	if (!isResFloatVec && outScalarSize == 1)
		op << "float(res)";
	else if (!isResFloatVec)
		op << "vec" << outScalarSize << "(res)";
	else
		op << "res";

	op << ";\n";

	// Scale & bias.
	float	resultScale		= spec.resultScale;
	float	resultBias		= spec.resultBias;
	if ((resultScale != 1.0f) || (resultBias != 0.0f))
	{
		op << "\tcolor = color";
		if (resultScale != 1.0f) op << " * " << de::floatToString(resultScale, 2);
		if (resultBias != 0.0f)  op << " + " << de::floatToString(resultBias, 2);
		op << ";\n";
	}

	// ..
	if (isVertexCase)
	{
		vtx << "	v_color = color;\n";
		frag << "	gl_FragColor = v_color;\n";
	}
	else
	{
		for (int i = 0; i < spec.numInputs; i++)
		vtx << "	v_in" << i << " = a_in" << i << ";\n";
		frag << "	gl_FragColor = color;\n";
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	// Setup the user attributes.
	m_userAttribTransforms.resize(spec.numInputs);
	for (int inputNdx = 0; inputNdx < spec.numInputs; inputNdx++)
	{
		const ShaderValue& v = spec.inputs[inputNdx];
		DE_ASSERT(v.type != TYPE_LAST);

		float scale		= (v.rangeMax - v.rangeMin);
		float minBias	= v.rangeMin;
		float maxBias	= v.rangeMax;
		Mat4  attribMatrix;

		for (int rowNdx = 0; rowNdx < 4; rowNdx++)
		{
			Vec4 row;

			switch ((rowNdx + inputNdx) % 4)
			{
				case 0:	row = Vec4(scale, 0.0f, 0.0f, minBias);		break;
				case 1:	row = Vec4(0.0f, scale, 0.0f, minBias);		break;
				case 2:	row = Vec4(-scale, 0.0f, 0.0f, maxBias);	break;
				case 3:	row = Vec4(0.0f, -scale, 0.0f, maxBias);	break;
				default: DE_ASSERT(false);
			}

			attribMatrix.setRow(rowNdx, row);
		}

		m_userAttribTransforms[inputNdx] = attribMatrix;
	}
}